

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall
PType::AddConversion
          (PType *this,PType *target,
          _func_void_ZCC_ExprConstant_ptr_FSharedStringArena_ptr *convertconst)

{
  uint uVar1;
  uint uVar2;
  Conversion *pCVar3;
  Conversion local_40;
  uint local_2c;
  _func_void_ZCC_ExprConstant_ptr_FSharedStringArena_ptr *p_Stack_28;
  uint i;
  _func_void_ZCC_ExprConstant_ptr_FSharedStringArena_ptr *convertconst_local;
  PType *target_local;
  PType *this_local;
  
  local_2c = 0;
  p_Stack_28 = convertconst;
  convertconst_local = (_func_void_ZCC_ExprConstant_ptr_FSharedStringArena_ptr *)target;
  target_local = this;
  while( true ) {
    uVar1 = local_2c;
    uVar2 = TArray<PType::Conversion,_PType::Conversion>::Size(&this->Conversions);
    if (uVar2 <= uVar1) {
      Conversion::Conversion(&local_40,(PType *)convertconst_local,p_Stack_28);
      TArray<PType::Conversion,_PType::Conversion>::Push(&this->Conversions,&local_40);
      return true;
    }
    pCVar3 = TArray<PType::Conversion,_PType::Conversion>::operator[]
                       (&this->Conversions,(ulong)local_2c);
    if (pCVar3->TargetType == (PType *)convertconst_local) break;
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

bool PType::AddConversion(PType *target, void (*convertconst)(ZCC_ExprConstant *, class FSharedStringArena &))
{
	// Make sure a conversion hasn't already been registered
	for (unsigned i = 0; i < Conversions.Size(); ++i)
	{
		if (Conversions[i].TargetType == target)
			return false;
	}
	Conversions.Push(Conversion(target, convertconst));
	return true;
}